

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_trim(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  char cVar1;
  char *zString;
  ushort **ppuVar2;
  char *pcVar3;
  char *pcVar4;
  uint uVar5;
  jx9_value *pVal;
  ulong uVar6;
  char *pcVar7;
  long lVar8;
  jx9_context *pjVar9;
  bool bVar10;
  int nLen;
  int nListlen;
  uint local_44;
  jx9_context *local_40;
  uint local_34;
  
  if (nArg < 1) {
    jx9MemObjRelease(pCtx->pRet);
    return 0;
  }
  zString = jx9_value_to_string(*apArg,(int *)&local_44);
  if (0 < (int)local_44) {
    if (nArg == 1) {
      pcVar7 = zString + local_44;
      lVar8 = 0;
      uVar5 = local_44;
      local_40 = pCtx;
      do {
        uVar5 = uVar5 - 1;
        cVar1 = *zString;
        if ((0xffffffffffffffbf < (ulong)(long)cVar1) ||
           ((cVar1 != '\0' &&
            (ppuVar2 = __ctype_b_loc(),
            (*(byte *)((long)*ppuVar2 + (long)cVar1 * 2 + 1) & 0x20) == 0)))) {
          pjVar9 = local_40;
          lVar8 = (ulong)local_44 - lVar8;
          goto LAB_00130891;
        }
        zString = zString + 1;
        lVar8 = lVar8 + 1;
      } while (local_44 != (uint)lVar8);
      zString = pcVar7;
      pjVar9 = local_40;
      local_44 = 0;
      goto LAB_001308c1;
    }
    pcVar7 = jx9_value_to_string(apArg[1],(int *)&local_34);
    if ((long)(int)local_34 < 1) {
      pVal = pCtx->pRet;
      goto LAB_00130930;
    }
    pcVar3 = zString + (int)local_44;
    pcVar4 = zString;
    do {
      zString = pcVar4;
      if (pcVar3 <= pcVar4) break;
      lVar8 = 0;
      do {
        if (zString < pcVar3) {
          zString = zString + (*zString == pcVar7[lVar8]);
        }
        lVar8 = lVar8 + 1;
      } while ((int)local_34 != lVar8);
      bVar10 = zString != pcVar4;
      pcVar4 = zString;
    } while (bVar10);
    pcVar4 = pcVar3 + -1;
    do {
      pcVar3 = pcVar4;
      if (pcVar4 <= zString) break;
      uVar6 = 0;
      do {
        if (zString < pcVar3) {
          pcVar3 = pcVar3 + -(ulong)(*pcVar3 == pcVar7[uVar6]);
        }
        uVar6 = uVar6 + 1;
      } while (local_34 != uVar6);
      bVar10 = pcVar3 != pcVar4;
      pcVar4 = pcVar3;
    } while (bVar10);
    if (zString < pcVar3) {
      local_44 = ((int)pcVar3 - (int)zString) + 1;
      pVal = pCtx->pRet;
      goto LAB_00130930;
    }
  }
  pVal = pCtx->pRet;
  zString = "";
  local_44 = 0;
  goto LAB_00130930;
  while( true ) {
    lVar8 = lVar8 + -1;
    uVar5 = uVar5 - 1;
    if ((int)lVar8 == 0) break;
LAB_00130891:
    cVar1 = zString[uVar5];
    local_44 = (uint)lVar8;
    if ((0xffffffffffffffbf < (ulong)(long)cVar1) ||
       ((cVar1 != '\0' &&
        (ppuVar2 = __ctype_b_loc(), (*(byte *)((long)*ppuVar2 + (long)cVar1 * 2 + 1) & 0x20) == 0)))
       ) goto LAB_001308c1;
  }
  local_44 = 0;
LAB_001308c1:
  pVal = pjVar9->pRet;
LAB_00130930:
  jx9_value_string(pVal,zString,local_44);
  return 0;
}

Assistant:

static int jx9Builtin_trim(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zString;
	int nLen;
	if( nArg < 1 ){
		/* Missing arguments, return null */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Extract the target string */
	zString = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Empty string, return */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Start the trim process */
	if( nArg < 2 ){
		SyString sStr;
		/* Remove white spaces and NUL bytes */
		SyStringInitFromBuf(&sStr, zString, nLen);
		SyStringFullTrimSafe(&sStr);
		jx9_result_string(pCtx, sStr.zString, (int)sStr.nByte);
	}else{
		/* Char list */
		const char *zList;
		int nListlen;
		zList = jx9_value_to_string(apArg[1], &nListlen);
		if( nListlen < 1 ){
			/* Return the string unchanged */
			jx9_result_string(pCtx, zString, nLen);
		}else{
			const char *zEnd = &zString[nLen];
			const char *zCur = zString;
			const char *zPtr;
			int i;
			/* Left trim */
			for(;;){
				if( zCur >= zEnd ){
					break;
				}
				zPtr = zCur;
				for( i = 0 ; i < nListlen ; i++ ){
					if( zCur < zEnd && zCur[0] == zList[i] ){
						zCur++;
					}
				}
				if( zCur == zPtr ){
					/* No match, break immediately */
					break;
				}
			}
			/* Right trim */
			zEnd--;
			for(;;){
				if( zEnd <= zCur ){
					break;
				}
				zPtr = zEnd;
				for( i = 0 ; i < nListlen ; i++ ){
					if( zEnd > zCur && zEnd[0] == zList[i] ){
						zEnd--;
					}
				}
				if( zEnd == zPtr ){
					break;
				}
			}
			if( zCur >= zEnd ){
				/* Return the empty string */
				jx9_result_string(pCtx, "", 0);
			}else{
				zEnd++;
				jx9_result_string(pCtx, zCur, (int)(zEnd-zCur));
			}
		}
	}
	return JX9_OK;
}